

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

void __thiscall QSpanCollection::clear(QSpanCollection *this)

{
  list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_> *in_RDI;
  
  qDeleteAll<std::__cxx11::list<QSpanCollection::Span*,std::allocator<QSpanCollection::Span*>>>
            (in_RDI);
  QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear
            ((QMap<int,_QMap<int,_QSpanCollection::Span_*>_> *)in_RDI);
  std::__cxx11::list<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>::clear
            (in_RDI);
  return;
}

Assistant:

void QSpanCollection::clear()
{
    qDeleteAll(spans);
    index.clear();
    spans.clear();
}